

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gate.cpp
# Opt level: O0

int __thiscall tiles::Gate::init(Gate *this,EVP_PKEY_CTX *ctx)

{
  TileData *pTVar1;
  uint in_ECX;
  undefined4 in_EDX;
  uint in_R8D;
  byte in_R9B;
  TileData *tileData;
  undefined4 in_stack_ffffffffffffffc8;
  
  pTVar1 = TileType::modifyTileData
                     ((TileType *)CONCAT44(in_EDX,in_ECX),
                      (Chunk *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),0);
  *pTVar1 = (TileData)((uint)*pTVar1 & 0xffffffe0 | in_ECX & 0x1f);
  *pTVar1 = (TileData)((uint)*pTVar1 & 0xfffffcff | (in_R9B & 3) << 8);
  *pTVar1 = (TileData)((uint)*pTVar1 & 0xfffff3ff);
  *pTVar1 = (TileData)((uint)*pTVar1 & 0xffffcfff | (in_R8D & 3) << 0xc);
  *pTVar1 = (TileData)((uint)*pTVar1 & 0xffff);
  return (int)pTVar1;
}

Assistant:

void Gate::init(Chunk& chunk, unsigned int tileIndex, TileId::t gateId, Direction::t direction, State::t state) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    assert(gateId >= TileId::gateDiode && gateId <= TileId::gateXnor);
    tileData.id = gateId;
    tileData.state1 = state;
    tileData.state2 = State::disconnected;
    tileData.dir = direction;
    tileData.meta = 0;
}